

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp-test.cc
# Opt level: O3

void __thiscall SPTest_ConWithRandomVar_Test::TestBody(SPTest_ConWithRandomVar_Test *this)

{
  int iVar1;
  pointer piVar2;
  bool bVar3;
  char *pcVar4;
  AssertionResult gtest_ar;
  ColumnSizeHandler cols;
  TestProblem p;
  SPAdapter sp;
  NLHeader header;
  Message local_740;
  AssertHelper local_738;
  internal local_730 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_728;
  ColumnSizeHandler local_720;
  TestProblem local_718;
  SPAdapter local_368;
  NLHeader local_120;
  
  memset(&local_120,0,0xa8);
  local_120.super_NLInfo.super_NLInfo_C.format = 1;
  local_120.super_NLInfo.super_NLInfo_C.num_ampl_options = 3;
  local_120.super_NLInfo.super_NLInfo_C.prob_name = "nl_instance";
  local_120.super_NLInfo.super_NLInfo_C.ampl_vbtol = 0.0;
  local_120.super_NLInfo.super_NLInfo_C.arith_kind = 1;
  local_120.super_NLInfo.super_NLInfo_C.flags = 1;
  local_120.super_NLInfo.super_NLInfo_C.ampl_options[3] = 0;
  local_120.super_NLInfo.super_NLInfo_C.ampl_options[4] = 0;
  local_120.super_NLInfo.super_NLInfo_C.ampl_options[5] = 0;
  local_120.super_NLInfo.super_NLInfo_C.ampl_options[6] = 0;
  local_120.super_NLInfo.super_NLInfo_C.ampl_options[7] = 0;
  local_120.super_NLInfo.super_NLInfo_C.ampl_options[8] = 0;
  local_120.super_NLInfo.super_NLInfo_C.ampl_options[2] = 0;
  local_120.super_NLInfo.super_NLInfo_C.ampl_options[0] = 1;
  local_120.super_NLInfo.super_NLInfo_C.ampl_options[1] = 1;
  local_120.super_NLProblemInfo.super_NLProblemInfo_C.num_vars = 1;
  local_120.super_NLProblemInfo.super_NLProblemInfo_C.num_con_nonzeros = 1;
  TestProblem::TestProblem(&local_718,&local_120);
  TestProblem::MakeTestRV(&local_718);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon
            ((BasicProblem<mp::BasicProblemParams<int>_> *)&local_718,0.0,0.0);
  local_720.problem_ = local_718.builder_.super_NLProblemBuilder<mp::ColProblem>.builder_;
  mp::ColProblemBuilder::ColumnSizeHandler::Add(&local_720,1);
  gch::detail::small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::request_capacity
            ((small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> *)
             ((local_718.builder_.super_NLProblemBuilder<mp::ColProblem>.builder_)->super_Problem).
             algebraic_cons_.
             super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
             ._M_impl.super__Vector_impl_data._M_start,0);
  piVar2 = ((local_718.builder_.super_NLProblemBuilder<mp::ColProblem>.builder_)->col_starts_).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  iVar1 = piVar2[1];
  piVar2[1] = iVar1 + 1;
  ((local_718.builder_.super_NLProblemBuilder<mp::ColProblem>.builder_)->row_indices_).
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[iVar1] = 0;
  ((local_718.builder_.super_NLProblemBuilder<mp::ColProblem>.builder_)->coefs_).
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
  [iVar1] = 1.0;
  mp::SPAdapter::SPAdapter(&local_368,&local_718.super_ColProblem);
  local_740.ss_.ptr_._0_4_ = 1;
  local_738.data_._0_4_ =
       (int)((ulong)((long)((local_368.problem_)->super_Problem).algebraic_cons_.
                           super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)((local_368.problem_)->super_Problem).algebraic_cons_.
                          super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0xf0f0f0f;
  testing::internal::CmpHelperEQ<int,int>
            (local_730,"1","sp.num_cons()",(int *)&local_740,(int *)&local_738);
  if (local_730[0] == (internal)0x0) {
    testing::Message::Message(&local_740);
    if (local_728.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_728.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_738,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x20f,
               pcVar4);
    testing::internal::AssertHelper::operator=(&local_738,&local_740);
    testing::internal::AssertHelper::~AssertHelper(&local_738);
    if (CONCAT44(local_740.ss_.ptr_._4_4_,local_740.ss_.ptr_._0_4_) != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((long *)CONCAT44(local_740.ss_.ptr_._4_4_,local_740.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_740.ss_.ptr_._4_4_,local_740.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_728,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_740.ss_.ptr_._0_4_ = 2;
  local_738.data_._0_4_ = local_368.num_stages_;
  testing::internal::CmpHelperEQ<int,int>
            (local_730,"2","sp.num_stages()",(int *)&local_740,(int *)&local_738);
  if (local_730[0] == (internal)0x0) {
    testing::Message::Message(&local_740);
    if (local_728.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_728.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_738,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x210,
               pcVar4);
    testing::internal::AssertHelper::operator=(&local_738,&local_740);
    testing::internal::AssertHelper::~AssertHelper(&local_738);
    if (CONCAT44(local_740.ss_.ptr_._4_4_,local_740.ss_.ptr_._0_4_) != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((long *)CONCAT44(local_740.ss_.ptr_._4_4_,local_740.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_740.ss_.ptr_._4_4_,local_740.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_728,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_740.ss_.ptr_._0_4_ = 0;
  local_738.data_._0_4_ =
       *local_368.num_stage_cons_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start;
  testing::internal::CmpHelperEQ<int,int>
            (local_730,"0","sp.stage(0).num_cons()",(int *)&local_740,(int *)&local_738);
  if (local_730[0] == (internal)0x0) {
    testing::Message::Message(&local_740);
    if (local_728.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_728.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_738,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x211,
               pcVar4);
    testing::internal::AssertHelper::operator=(&local_738,&local_740);
    testing::internal::AssertHelper::~AssertHelper(&local_738);
    if (CONCAT44(local_740.ss_.ptr_._4_4_,local_740.ss_.ptr_._0_4_) != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((long *)CONCAT44(local_740.ss_.ptr_._4_4_,local_740.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_740.ss_.ptr_._4_4_,local_740.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_728,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_740.ss_.ptr_._0_4_ = 1;
  local_738.data_._0_4_ =
       local_368.num_stage_cons_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[1];
  testing::internal::CmpHelperEQ<int,int>
            (local_730,"1","sp.stage(1).num_cons()",(int *)&local_740,(int *)&local_738);
  if (local_730[0] == (internal)0x0) {
    testing::Message::Message(&local_740);
    if (local_728.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_728.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_738,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x212,
               pcVar4);
    testing::internal::AssertHelper::operator=(&local_738,&local_740);
    testing::internal::AssertHelper::~AssertHelper(&local_738);
    if (CONCAT44(local_740.ss_.ptr_._4_4_,local_740.ss_.ptr_._0_4_) != 0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((long *)CONCAT44(local_740.ss_.ptr_._4_4_,local_740.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_740.ss_.ptr_._4_4_,local_740.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_728,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  mp::SPAdapter::~SPAdapter(&local_368);
  local_718.super_ColProblem.super_Problem.super_ExprFactory._vptr_BasicExprFactory =
       (_func_int **)&PTR__ColProblem_00198718;
  local_718.super_ColProblem.super_Problem.super_SuffixManager._vptr_SuffixManager =
       (_func_int **)&PTR__ColProblem_00198738;
  if (local_718.super_ColProblem.coefs_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_718.super_ColProblem.coefs_.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_718.super_ColProblem.coefs_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_718.super_ColProblem.coefs_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_718.super_ColProblem.row_indices_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_718.super_ColProblem.row_indices_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_718.super_ColProblem.row_indices_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)local_718.super_ColProblem.row_indices_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  if (local_718.super_ColProblem.col_starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_718.super_ColProblem.col_starts_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_718.super_ColProblem.col_starts_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)local_718.super_ColProblem.col_starts_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem
            ((BasicProblem<mp::BasicProblemParams<int>_> *)&local_718);
  return;
}

Assistant:

TEST(SPTest, ConWithRandomVar) {
  // Test that constraint that contains a random var belongs at least to
  // the second stage.
  auto header = MakeHeader(1);
  header.num_con_nonzeros = 1;
  TestProblem p(header);
  p.MakeTestRV();
  p.AddCon(0, 0);
  auto cols = p.OnColumnSizes();
  cols.Add(1);
  auto expr = p.OnLinearConExpr(0);
  expr.AddTerm(0, 1);
  mp::SPAdapter sp(p);
  EXPECT_EQ(1, sp.num_cons());
  EXPECT_EQ(2, sp.num_stages());
  EXPECT_EQ(0, sp.stage(0).num_cons());
  EXPECT_EQ(1, sp.stage(1).num_cons());
}